

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O2

void __thiscall
glcts::GPUShader5FmaAccuracyTest::logArray
          (GPUShader5FmaAccuracyTest *this,char *description,GLfloat *data,GLuint length)

{
  ostringstream *poVar1;
  MessageBuilder *pMVar2;
  ulong uVar3;
  bool bVar4;
  MessageBuilder message;
  undefined1 local_1b0 [384];
  
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,description);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"| ");
  uVar3 = (ulong)length;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    pMVar2 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,data);
    std::operator<<(&(pMVar2->m_str).super_basic_ostream<char,_std::char_traits<char>_>," | ");
    data = data + 1;
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  return;
}

Assistant:

void GPUShader5FmaAccuracyTest::logArray(const char* description, glw::GLfloat* data, glw::GLuint length)
{
	m_testCtx.getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

	tcu::MessageBuilder message = m_testCtx.getLog() << tcu::TestLog::Message;

	message << "| ";

	for (glw::GLuint i = 0; i < length; ++i)
	{
		message << data[i] << " | ";
	}

	message << tcu::TestLog::EndMessage;
}